

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O0

ssize_t __thiscall pstore::broker::player::read(player *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer t;
  undefined4 in_register_00000034;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  player *this_local;
  message_ptr *msg;
  
  lock._15_1_ = 0;
  message_pool::get_from_pool((message_pool *)this);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_30,(mutex_type *)CONCAT44(in_register_00000034,__fd));
  t = std::
      unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
      ::get((unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             *)this);
  pstore::file::file_base::read<pstore::brokerface::message_type,void>
            ((file_base *)((mutex_type *)CONCAT44(in_register_00000034,__fd) + 1),t);
  lock._15_1_ = 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  if ((lock._15_1_ & 1) == 0) {
    std::
    unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
    ::~unique_ptr((unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                   *)this);
  }
  return (ssize_t)this;
}

Assistant:

brokerface::message_ptr player::read () {
            brokerface::message_ptr msg = pool.get_from_pool ();
            std::unique_lock<decltype (mut_)> const lock (mut_);
            file_.read (msg.get ());
            return msg;
        }